

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O2

void burstsort_mkq_recursiveburst_1(uchar **strings,size_t N)

{
  byte bVar1;
  uchar *__ptr;
  byte bVar2;
  uchar uVar3;
  uint uVar4;
  _Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *p_Var5;
  TSTNode<unsigned_char> *pTVar6;
  pointer ppuVar7;
  TSTNode<unsigned_char> *pTVar8;
  size_t sVar9;
  size_t __size;
  uint uVar10;
  pointer ppuVar11;
  ulong uVar12;
  BurstRecursive<unsigned_char> local_89;
  _Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *local_88;
  uchar *local_80;
  uchar *str;
  uchar **local_70;
  size_t local_68;
  size_t local_60;
  TSTNode<unsigned_char> root;
  
  TSTNode<unsigned_char>::TSTNode(&root);
  local_68 = N;
  root.pivot = pseudo_median<unsigned_char>(strings,N,0);
  sVar9 = 0;
  local_70 = strings;
  while (sVar9 != local_68) {
    str = strings[sVar9];
    local_60 = sVar9;
    bVar2 = get_char<unsigned_char>(str,0);
    pTVar8 = &root;
    sVar9 = 0;
    while( true ) {
      bVar1 = pTVar8->pivot;
      uVar10 = (uint)(bVar2 == bVar1) + (uint)(bVar1 <= bVar2 && bVar2 != bVar1) * 2;
      if (((uint)(pTVar8->is_tst).super__Base_bitset<1UL>._M_w >> uVar10 & 1) == 0) break;
      if (uVar10 == 1) {
        sVar9 = sVar9 + 1;
        bVar2 = get_char<unsigned_char>(str,sVar9);
      }
      pTVar8 = (TSTNode<unsigned_char> *)(pTVar8->buckets)._M_elems[uVar10];
    }
    p_Var5 = (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
             (pTVar8->buckets)._M_elems[uVar10];
    if (p_Var5 == (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x0) {
      p_Var5 = (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)operator_new(0x18)
      ;
      (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&p_Var5->_M_impl)->
      _M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
      (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&p_Var5->_M_impl)->
      _M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
      (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&p_Var5->_M_impl)->
      _M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pTVar8->buckets)._M_elems[uVar10] = p_Var5;
    }
    local_88 = p_Var5;
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)p_Var5,&str);
    if ((uVar10 != 1) || (pTVar8->pivot != '\0')) {
      ppuVar7 = (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                 &local_88->_M_impl)->_M_impl).super__Vector_impl_data._M_start;
      ppuVar11 = (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                  &local_88->_M_impl)->_M_impl).super__Vector_impl_data._M_finish;
      __size = (long)ppuVar11 - (long)ppuVar7 >> 3;
      if ((0x2000 < __size) &&
         (ppuVar11 ==
          (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&local_88->_M_impl)->
          _M_impl).super__Vector_impl_data._M_end_of_storage)) {
        sVar9 = sVar9 + (uVar10 == 1);
        local_80 = (uchar *)malloc(__size);
        for (uVar4 = 0; uVar12 = (ulong)uVar4, uVar12 < (ulong)((long)ppuVar11 - (long)ppuVar7 >> 3)
            ; uVar4 = uVar4 + 1) {
          uVar3 = get_char<unsigned_char>(ppuVar7[uVar12],sVar9);
          local_80[uVar12] = uVar3;
          ppuVar7 = (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                     &local_88->_M_impl)->_M_impl).super__Vector_impl_data._M_start;
          ppuVar11 = (((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                      &local_88->_M_impl)->_M_impl).super__Vector_impl_data._M_finish;
        }
        verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
                  (&root,0);
        __ptr = local_80;
        p_Var5 = local_88;
        pTVar6 = BurstRecursive<unsigned_char>::operator()
                           (&local_89,
                            (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)local_88,
                            local_80,sVar9);
        free(__ptr);
        std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base(p_Var5);
        operator_delete(p_Var5);
        (pTVar8->buckets)._M_elems[uVar10] = pTVar6;
        (pTVar8->is_tst).super__Base_bitset<1UL>._M_w =
             (pTVar8->is_tst).super__Base_bitset<1UL>._M_w | 1L << (sbyte)uVar10;
        verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
                  (&root,0);
        strings = local_70;
      }
    }
    sVar9 = local_60 + 1;
  }
  verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>(&root,0);
  burst_traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
            (&root,strings,0,0);
  return;
}

Assistant:

void burstsort_mkq_recursiveburst_1(unsigned char** strings, size_t N)
{ burstsort_mkq_recursiveburst<unsigned char>(strings, N); }